

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O2

Adjacency_Graph<true> * __thiscall
Disa::Adjacency_Graph<true>::reorder
          (Adjacency_Graph<true> *__return_storage_ptr__,Adjacency_Graph<true> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permutation)

{
  source_location *psVar1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  pointer puVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  source_location *psVar10;
  difference_type __d;
  size_t *i_vertex;
  size_type __new_size;
  unsigned_long uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  psVar1 = (source_location *)
           (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar10 = (source_location *)
            (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  __first._M_current =
       (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  lVar4 = 0;
  if (psVar1 != psVar10) {
    lVar4 = ((long)psVar1 - (long)psVar10 >> 3) + -1;
  }
  if ((long)__last._M_current - (long)__first._M_current >> 3 == lVar4) {
    dVar12 = std::
             accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,double>
                       (__first,__last,0.0);
    psVar1 = (source_location *)
             (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    psVar10 = (source_location *)
              (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    __new_size = (long)psVar1 - (long)psVar10 >> 3;
    lVar4 = 0;
    if (psVar1 != psVar10) {
      lVar4 = __new_size - 1;
    }
    lVar4 = (lVar4 + -1) * lVar4;
    auVar13._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar13._0_8_ = lVar4;
    auVar13._12_4_ = 0x45300000;
    dVar14 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 0.5;
    if ((dVar12 == dVar14) && (!NAN(dVar12) && !NAN(dVar14))) {
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->offset,__new_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->vertex_adjacent_list,
                 (long)(this->vertex_adjacent_list).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->vertex_adjacent_list).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      puVar5 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
      if (8 < uVar8) {
        puVar2 = (__return_storage_ptr__->offset).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *puVar2 = 0;
        lVar9 = (long)uVar8 >> 3;
        puVar3 = (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        for (lVar4 = 1; lVar9 != lVar4; lVar4 = lVar4 + 1) {
          puVar2[puVar3[lVar4 + -1] + 1] = puVar5[lVar4] - puVar5[lVar4 + -1];
        }
        for (lVar4 = 1; lVar9 != lVar4; lVar4 = lVar4 + 1) {
          puVar2[lVar4] = puVar2[lVar4] + puVar2[lVar4 + -1];
        }
      }
      local_130._M_dataplus._M_p = (pointer)0x0;
      while( true ) {
        lVar4 = (long)(this->offset).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar5;
        if ((lVar4 == 0) || ((pointer)((lVar4 >> 3) - 1U) <= local_130._M_dataplus._M_p)) break;
        i_vertex = (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + (long)local_130._M_dataplus._M_p;
        pVar15 = vertex_adjacency_iter(this,(size_t *)&local_130);
        puVar5 = (__return_storage_ptr__->vertex_adjacent_list).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (__return_storage_ptr__->offset).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*i_vertex];
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,permutation);
        puVar5 = puVar5 + uVar11;
        for (_Var6 = pVar15.first._M_current;
            _Var6._M_current != pVar15.second._M_current._M_current;
            _Var6._M_current = _Var6._M_current + 1) {
          *puVar5 = local_f0._M_impl.super__Vector_impl_data._M_start[*_Var6._M_current];
          puVar5 = puVar5 + 1;
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_f0);
        pVar15 = vertex_adjacency_iter(__return_storage_ptr__,i_vertex);
        std::
        __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pVar15.first._M_current._M_current,pVar15.second._M_current._M_current);
        local_130._M_dataplus._M_p = local_130._M_dataplus._M_p + 1;
        puVar5 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      swap(this,__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,"\n");
    local_110._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001695b8;
    console_format_abi_cxx11_(&local_130,(Disa *)0x0,(Log_Level)&local_110,psVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_130);
    poVar7 = std::operator<<(poVar7,
                             "Checksum for parsed re_ordering failed, are the elements unique?");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"\n");
    local_38 = &PTR_s__workspace_llm4binary_github_lic_001695a0;
    console_format_abi_cxx11_(&local_130,(Disa *)0x0,(Log_Level)&local_38,psVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_130);
    std::__cxx11::to_string
              (&local_b8,
               (long)(permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_98,"Incorrect sizes, ",&local_b8);
    std::operator+(&local_78,&local_98," vs. ");
    puVar5 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    if (puVar5 != puVar2) {
      uVar11 = ((long)puVar5 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_d8,uVar11);
    std::operator+(&local_58,&local_78,&local_d8);
    std::operator+(&local_110,&local_58,".");
    poVar7 = std::operator<<(poVar7,(string *)&local_110);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_130);
  exit(1);
}

Assistant:

Adjacency_Graph<_directed> Adjacency_Graph<_directed>::reorder(const std::vector<std::size_t>& permutation) {

  ASSERT_DEBUG(permutation.size() == size_vertex(), "Incorrect sizes, " + std::to_string(permutation.size()) + " vs. " +
                                                    std::to_string(size_vertex()) + ".");
  ASSERT_DEBUG(
  std::accumulate(permutation.begin(), permutation.end(), 0.0) == (size_vertex() - 1) * size_vertex() / 2.0,
  "Checksum for parsed re_ordering failed, are the elements unique?");

  // Allocate memory.
  Adjacency_Graph graph;
  graph.offset.resize(offset.size());
  graph.vertex_adjacent_list.resize(vertex_adjacent_list.size());

  // Set up the offsets for the new graph.
  if(!empty()) {
    graph.offset[0] = 0;
    FOR(i_old, size_vertex()) graph.offset[permutation[i_old] + 1] = offset[i_old + 1] - offset[i_old];
    FOR(i_new, size_vertex()) graph.offset[i_new + 1] += graph.offset[i_new];
  }

  // Populate the new graph using the reorder mapping.
  FOR(i_old, size_vertex()) {
    const std::size_t& i_new = permutation[i_old];
    auto adjacency_iter = vertex_adjacency_iter(i_old);
    std::transform(adjacency_iter.first, adjacency_iter.second,
                   std::next(graph.vertex_adjacent_list.begin(), static_cast<s_size_t>(graph.offset[i_new])),
                   [permutation](const std::size_t& i_old) { return permutation[i_old]; });
    adjacency_iter = graph.vertex_adjacency_iter(i_new);
    std::sort(adjacency_iter.first, adjacency_iter.second);
  }

  // swap class data and return.
  this->swap(graph);
  return graph;
}